

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WordTagger.pb.cc
# Opt level: O0

char * __thiscall
CoreML::Specification::CoreMLModels::WordTagger::_InternalParse
          (WordTagger *this,char *ptr,ParseContext *ctx)

{
  uint tag_00;
  ParseContext *this_00;
  bool bVar1;
  uint uVar2;
  uint32_t uVar3;
  string *psVar4;
  StringVector *msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  string *str_5;
  string *str_4;
  string *str_3;
  string *str_2;
  string *str_1;
  string *str;
  ParseContext *pPStack_20;
  uint32_t tag;
  ParseContext *ctx_local;
  char *ptr_local;
  WordTagger *this_local;
  
  pPStack_20 = ctx;
  ctx_local = (ParseContext *)ptr;
  ptr_local = (char *)this;
  do {
    while( true ) {
      bVar1 = google::protobuf::internal::ParseContext::Done(pPStack_20,(char **)&ctx_local);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        return (char *)ctx_local;
      }
      ctx_local = (ParseContext *)
                  google::protobuf::internal::ReadTag
                            ((char *)ctx_local,(uint32_t *)((long)&str + 4),0);
      this_00 = pPStack_20;
      tag_00 = str._4_4_;
      uVar2 = str._4_4_ >> 3;
      if (uVar2 == 1) {
        if ((str._4_4_ & 0xff) == 8) {
          uVar3 = google::protobuf::internal::ReadVarint32((char **)&ctx_local);
          this->revision_ = uVar3;
          goto joined_r0x003e3403;
        }
        goto LAB_003e3587;
      }
      if (uVar2 != 10) break;
      if ((str._4_4_ & 0xff) != 0x52) goto LAB_003e3587;
      psVar4 = _internal_mutable_language_abi_cxx11_(this);
      ctx_local = (ParseContext *)
                  google::protobuf::internal::InlineGreedyStringParser
                            (psVar4,(char *)ctx_local,pPStack_20);
      bVar1 = google::protobuf::internal::VerifyUTF8(psVar4,(char *)0x0);
joined_r0x003e331a:
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        return (char *)(ParseContext *)0x0;
      }
joined_r0x003e3403:
      if (ctx_local == (ParseContext *)0x0) {
        return (char *)(ParseContext *)0x0;
      }
    }
    if (uVar2 == 0x14) {
      if ((str._4_4_ & 0xff) == 0xa2) {
        psVar4 = _internal_mutable_tokensoutputfeaturename_abi_cxx11_(this);
        ctx_local = (ParseContext *)
                    google::protobuf::internal::InlineGreedyStringParser
                              (psVar4,(char *)ctx_local,pPStack_20);
        bVar1 = google::protobuf::internal::VerifyUTF8(psVar4,(char *)0x0);
        goto joined_r0x003e331a;
      }
LAB_003e3587:
      if ((str._4_4_ == 0) || ((str._4_4_ & 7) == 4)) {
        if (ctx_local == (ParseContext *)0x0) {
          return (char *)(ParseContext *)0x0;
        }
        google::protobuf::internal::EpsCopyInputStream::SetLastTag
                  (&pPStack_20->super_EpsCopyInputStream,str._4_4_);
        return (char *)ctx_local;
      }
      unknown = google::protobuf::internal::InternalMetadata::
                mutable_unknown_fields<std::__cxx11::string>
                          (&(this->super_MessageLite)._internal_metadata_);
      ctx_local = (ParseContext *)
                  google::protobuf::internal::UnknownFieldParse
                            (tag_00,unknown,(char *)ctx_local,pPStack_20);
    }
    else {
      if (uVar2 == 0x15) {
        if ((str._4_4_ & 0xff) == 0xaa) {
          psVar4 = _internal_mutable_tokentagsoutputfeaturename_abi_cxx11_(this);
          ctx_local = (ParseContext *)
                      google::protobuf::internal::InlineGreedyStringParser
                                (psVar4,(char *)ctx_local,pPStack_20);
          bVar1 = google::protobuf::internal::VerifyUTF8(psVar4,(char *)0x0);
          goto joined_r0x003e331a;
        }
        goto LAB_003e3587;
      }
      if (uVar2 == 0x16) {
        if ((str._4_4_ & 0xff) == 0xb2) {
          psVar4 = _internal_mutable_tokenlocationsoutputfeaturename_abi_cxx11_(this);
          ctx_local = (ParseContext *)
                      google::protobuf::internal::InlineGreedyStringParser
                                (psVar4,(char *)ctx_local,pPStack_20);
          bVar1 = google::protobuf::internal::VerifyUTF8(psVar4,(char *)0x0);
          goto joined_r0x003e331a;
        }
        goto LAB_003e3587;
      }
      if (uVar2 == 0x17) {
        if ((str._4_4_ & 0xff) == 0xba) {
          psVar4 = _internal_mutable_tokenlengthsoutputfeaturename_abi_cxx11_(this);
          ctx_local = (ParseContext *)
                      google::protobuf::internal::InlineGreedyStringParser
                                (psVar4,(char *)ctx_local,pPStack_20);
          bVar1 = google::protobuf::internal::VerifyUTF8(psVar4,(char *)0x0);
          if (((bVar1 ^ 0xffU) & 1) != 0) {
            return (char *)(ParseContext *)0x0;
          }
          goto joined_r0x003e3403;
        }
        goto LAB_003e3587;
      }
      if (uVar2 == 100) {
        if ((str._4_4_ & 0xff) == 0x22) {
          psVar4 = _internal_mutable_modelparameterdata_abi_cxx11_(this);
          ctx_local = (ParseContext *)
                      google::protobuf::internal::InlineGreedyStringParser
                                (psVar4,(char *)ctx_local,pPStack_20);
          goto joined_r0x003e3403;
        }
        goto LAB_003e3587;
      }
      if ((uVar2 != 200) || ((str._4_4_ & 0xff) != 0x42)) goto LAB_003e3587;
      msg = _internal_mutable_stringtags(this);
      ctx_local = (ParseContext *)
                  google::protobuf::internal::ParseContext::ParseMessage
                            (this_00,&msg->super_MessageLite,(char *)ctx_local);
    }
    if (ctx_local == (ParseContext *)0x0) {
      return (char *)(ParseContext *)0x0;
    }
  } while( true );
}

Assistant:

const char* WordTagger::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // uint32 revision = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 8)) {
          revision_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // string language = 10;
      case 10:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 82)) {
          auto str = _internal_mutable_language();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // string tokensOutputFeatureName = 20;
      case 20:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 162)) {
          auto str = _internal_mutable_tokensoutputfeaturename();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // string tokenTagsOutputFeatureName = 21;
      case 21:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 170)) {
          auto str = _internal_mutable_tokentagsoutputfeaturename();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // string tokenLocationsOutputFeatureName = 22;
      case 22:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 178)) {
          auto str = _internal_mutable_tokenlocationsoutputfeaturename();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // string tokenLengthsOutputFeatureName = 23;
      case 23:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 186)) {
          auto str = _internal_mutable_tokenlengthsoutputfeaturename();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // bytes modelParameterData = 100;
      case 100:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 34)) {
          auto str = _internal_mutable_modelparameterdata();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.StringVector stringTags = 200;
      case 200:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 66)) {
          ptr = ctx->ParseMessage(_internal_mutable_stringtags(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}